

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void __thiscall ON_Mesh::Dump(ON_Mesh *this,ON_TextLog *dump)

{
  undefined8 *puVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  Type TVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ON_SimpleArray<ON_3dPoint> *this_00;
  ON_3fPoint *p_00;
  ON_2fPoint *p_01;
  ON_2dPoint *pOVar13;
  ON_Color *pOVar14;
  ON_SurfaceCurvature *pOVar15;
  ON_MeshFace *pOVar16;
  ON_3fVector *pOVar17;
  ON_MeshNgon *this_01;
  char *pcVar18;
  bool local_25d;
  int inner_boundary_count;
  int outer_boundary_count;
  int bcount;
  ON_MeshNgon *ngon;
  ON_TextLogIndent indent2_8;
  undefined1 local_230 [4];
  int ngon_count;
  ON_MeshFaceList mesh_face_list;
  ON_TextLogIndent indent2_7;
  ON_TextLogIndent indent2_6;
  ON_SurfaceCurvature k;
  undefined1 local_1e0 [8];
  ON_TextLogIndent indent2_5;
  ON_wString s;
  ON_TextLogIndent indent2_4;
  ON_2dPoint srfuv;
  ON_TextLogIndent indent2_3;
  ON_2dPoint tp;
  ON_TextLogIndent indent2_2;
  ON_TextLogIndent indent2_1;
  ON_3dPoint *D;
  ON_TextLogIndent indent2;
  ON_TextLogIndent indent1;
  ON_TextLogIndent indent1_3;
  ON_SubDDisplayParameters subdmp;
  ON_TextLogIndent indent1_2;
  ON_TextLogIndent indent1_1;
  ON_String local_c8;
  ON_String local_c0;
  ON_String local_b8;
  ON_String local_b0;
  ON_String local_a8;
  ON_String description;
  ON_MeshParameters *mp;
  ON_wString local_80;
  ON_wString local_78;
  ON_wString local_70;
  ON_wString local_68;
  bool local_59;
  undefined8 uStack_58;
  bool bDoubles;
  ON_3dPoint q;
  ON_3dPoint p;
  int vcount;
  int i;
  int fcount;
  int half_max;
  ON_TextLog *dump_local;
  ON_Mesh *this_local;
  
  iVar9 = ON_SimpleArray<ON_MeshFace>::Count(&this->m_F);
  iVar10 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  local_25d = false;
  if (0 < iVar10) {
    bVar7 = HasDoublePrecisionVertices(this);
    local_25d = false;
    if (bVar7) {
      local_25d = HasSynchronizedDoubleAndSinglePrecisionVertices(this);
    }
  }
  local_59 = local_25d;
  uVar11 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  uVar12 = ON_SimpleArray<ON_MeshFace>::Count(&this->m_F);
  ON_TextLog::Print(dump,"ON_Mesh: vertex count = %d  facet count = %d\n",(ulong)uVar11,
                    (ulong)uVar12);
  pcVar18 = "false";
  if ((local_59 & 1U) != 0) {
    pcVar18 = "true";
  }
  ON_TextLog::Print(dump,"double precision: %s\n",pcVar18);
  bVar7 = HasVertexNormals(this);
  pcVar18 = "false";
  if (bVar7) {
    pcVar18 = "true";
  }
  ON_TextLog::Print(dump,"vertex normals:   %s\n",pcVar18);
  bVar7 = HasFaceNormals(this);
  pcVar18 = "false";
  if (bVar7) {
    pcVar18 = "true";
  }
  ON_TextLog::Print(dump,"face normals:     %s\n",pcVar18);
  bVar7 = HasNgons(this);
  pcVar18 = "false";
  if (bVar7) {
    pcVar18 = "true";
  }
  ON_TextLog::Print(dump,"n-gons:           %s\n",pcVar18);
  bVar7 = HasSurfaceParameters(this);
  pcVar18 = "false";
  if (bVar7) {
    pcVar18 = "true";
  }
  ON_TextLog::Print(dump,"srf parameters:   %s\n",pcVar18);
  bVar7 = HasTextureCoordinates(this);
  pcVar18 = "false";
  if (bVar7) {
    pcVar18 = "true";
  }
  ON_TextLog::Print(dump,"tex coords:       %s\n",pcVar18);
  bVar7 = HasPrincipalCurvatures(this);
  pcVar18 = "false";
  if (bVar7) {
    pcVar18 = "true";
  }
  ON_TextLog::Print(dump,"vertex kappa:     %s\n",pcVar18);
  bVar7 = HasVertexColors(this);
  pcVar18 = "false";
  if (bVar7) {
    pcVar18 = "true";
  }
  ON_TextLog::Print(dump,"vertex colors:    %s\n",pcVar18);
  ON_TextLog::Print(dump,"m_Ctag:\n");
  ON_TextLog::PushIndent(dump);
  ON_MappingTag::Dump(&this->m_Ctag,dump);
  ON_TextLog::PopIndent(dump);
  pcVar18 = "false";
  if ((this->m_packed_tex_rotate & 1U) != 0) {
    pcVar18 = "true";
  }
  ON_TextLog::Print(dump,"m_packed_tex_rotate: %s\n",pcVar18);
  dVar3 = ON_Interval::operator[]((ON_Interval *)&this->field_0x270,0);
  dVar4 = ON_Interval::operator[]((ON_Interval *)&this->field_0x270,1);
  dVar5 = ON_Interval::operator[]((ON_Interval *)&this->field_0x280,0);
  dVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x280,1);
  ON_TextLog::Print(dump,"m_packed_tex_domain: (%g,%g)x(%g,%g)\n",SUB84(dVar3,0),dVar4,dVar5,dVar6);
  dVar3 = ON_Interval::operator[]((ON_Interval *)&this->field_0x240,0);
  dVar4 = ON_Interval::operator[]((ON_Interval *)&this->field_0x240,1);
  dVar5 = ON_Interval::operator[]((ON_Interval *)&this->field_0x250,0);
  dVar6 = ON_Interval::operator[]((ON_Interval *)&this->field_0x250,1);
  ON_TextLog::Print(dump,"m_srf_domain: (%g,%g)x(%g,%g)\n",SUB84(dVar3,0),dVar4,dVar5,dVar6);
  ON_TextLog::Print(dump,"m_srf_scale: %g,%g\n",SUB84(this->m_srf_scale[0],0));
  ON_TextLog::Print(dump,"m_Ttag:\n");
  ON_TextLog::PushIndent(dump);
  ON_MappingTag::Dump(&this->m_Ttag,dump);
  ON_TextLog::PopIndent(dump);
  ON_wString::ON_wString(&local_78,L"Memory used: ");
  uVar11 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[8])();
  ON_wString::ToMemorySize(&local_80,(ulong)uVar11);
  ON_wString::operator+(&local_70,&local_78);
  ON_wString::ON_wString((ON_wString *)&mp,L"\n");
  ON_wString::operator+(&local_68,&local_70);
  ON_TextLog::Print(dump,&local_68);
  ON_wString::~ON_wString(&local_68);
  ON_wString::~ON_wString((ON_wString *)&mp);
  ON_wString::~ON_wString(&local_70);
  ON_wString::~ON_wString(&local_80);
  ON_wString::~ON_wString(&local_78);
  description.m_s = &MeshParameters(this)->m_bCustomSettings;
  if ((ON_MeshParameters *)description.m_s != (ON_MeshParameters *)0x0) {
    ON_String::ON_String(&local_a8);
    TVar8 = ON_MeshParameters::GeometrySettingsType((ON_MeshParameters *)description.m_s,true);
    switch(TVar8) {
    case Unset:
      ON_String::operator=(&local_a8,&ON_String::EmptyString);
      break;
    case Default:
      ON_String::ON_String(&local_b0,"ON_MeshParameters::DefaultMesh");
      ON_String::operator=(&local_a8,&local_b0);
      ON_String::~ON_String(&local_b0);
      break;
    case FastRender:
      ON_String::ON_String(&local_b8,"ON_MeshParameters::FastRenderMesh");
      ON_String::operator=(&local_a8,&local_b8);
      ON_String::~ON_String(&local_b8);
      break;
    case QualityRender:
      ON_String::ON_String(&local_c0,"ON_MeshParameters::QualityRenderMesh");
      ON_String::operator=(&local_a8,&local_c0);
      ON_String::~ON_String(&local_c0);
      break;
    case DefaultAnalysis:
      ON_String::ON_String(&local_c8,"ON_MeshParameters::DefaultAnalysisMesh");
      ON_String::operator=(&local_a8,&local_c8);
      ON_String::~ON_String(&local_c8);
      break;
    case FromMeshDensity:
      dVar3 = ON_MeshParameters::MeshDensity((ON_MeshParameters *)description.m_s);
      ON_String::FormatToString
                (&indent1_1.m_bEnabled,SUB84(dVar3,0),"ON_MeshParameters::CreateFromMeshDensity(%g)"
                );
      ON_String::operator=(&local_a8,(ON_String *)&indent1_1.m_bEnabled);
      ON_String::~ON_String((ON_String *)&indent1_1.m_bEnabled);
      break;
    default:
      ON_String::operator=(&local_a8,&ON_String::EmptyString);
      break;
    case Custom:
      ON_String::operator=(&local_a8,&ON_String::EmptyString);
    }
    ON_TextLog::PrintNewLine(dump);
    bVar7 = ON_String::IsNotEmpty(&local_a8);
    if (bVar7) {
      ON_TextLog::Print(dump,"NURBS, ON_Brep, ON_Extrusion meshing parameters:\n");
      ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&indent1_2.m_bEnabled,dump);
      pcVar18 = ON_String::operator_cast_to_char_(&local_a8);
      ON_TextLog::Print(dump,"%s\n",pcVar18);
      ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&indent1_2.m_bEnabled);
      ON_TextLog::Print(dump,"SubD meshing parameters:\n");
      ON_TextLogIndent::ON_TextLogIndent
                ((ON_TextLogIndent *)(subdmp.m_progress_reporter_interval.m_t + 1),dump);
      ON_MeshParameters::SubDDisplayParameters
                ((ON_SubDDisplayParameters *)&indent1_3.m_bEnabled,
                 (ON_MeshParameters *)description.m_s);
      ON_SubDDisplayParameters::Dump((ON_SubDDisplayParameters *)&indent1_3.m_bEnabled,dump);
      ON_TextLogIndent::~ON_TextLogIndent
                ((ON_TextLogIndent *)(subdmp.m_progress_reporter_interval.m_t + 1));
    }
    else {
      ON_TextLog::Print(dump,"Custom meshing parameters:\n");
      ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&indent1.m_bEnabled,dump);
      ON_MeshParameters::Dump((ON_MeshParameters *)description.m_s,dump);
      ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&indent1.m_bEnabled);
    }
    ON_TextLog::PrintNewLine(dump);
    ON_String::~ON_String(&local_a8);
  }
  ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&indent2.m_bEnabled,dump);
  uVar11 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  ON_TextLog::Print(dump,"%d mesh vertices:\n",(ulong)uVar11);
  ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&D,dump);
  Internal_PrintMeshArrayHash
            (dump,&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,L"m_V array hash",true);
  indent2_1.m_bEnabled = false;
  indent2_1._9_7_ = 0;
  if ((local_59 & 1U) != 0) {
    Internal_PrintMeshArrayHash
              (dump,&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,L"m_dV array hash",true);
    this_00 = &DoublePrecisionVertices(this)->super_ON_SimpleArray<ON_3dPoint>;
    indent2_1._8_8_ = ON_SimpleArray<ON_3dPoint>::Array(this_00);
  }
  for (p.z._4_4_ = 0; (int)p.z._4_4_ < iVar10; p.z._4_4_ = p.z._4_4_ + 1) {
    if ((p.z._4_4_ == 8) && (0x10 < iVar10)) {
      ON_TextLog::Print(dump,"...\n");
      p.z._4_4_ = iVar10 - 8;
    }
    else {
      p_00 = ON_SimpleArray<ON_3fPoint>::operator[]
                       (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,p.z._4_4_);
      ON_3dPoint::operator=((ON_3dPoint *)&q.z,p_00);
      if (indent2_1._8_8_ == 0) {
        ON_TextLog::Print(dump,"m_V[%d] = (%g,%g,%g)\n",SUB84(q.z,0),p.x,p.y,(ulong)p.z._4_4_);
      }
      else {
        q.y = *(double *)(indent2_1._8_8_ + 0x10 + (long)(int)p.z._4_4_ * 0x18);
        puVar1 = (undefined8 *)(indent2_1._8_8_ + (long)(int)p.z._4_4_ * 0x18);
        uStack_58 = *puVar1;
        q.x = (double)puVar1[1];
        ON_TextLog::Print(dump,"m_V[%d] = (%.17g,%.17g,%.17g) D = (%.17g,%.17g,%.17g)\n",
                          SUB84(q.z,0),p.x,p.y,uStack_58,q.x,q.y,(ulong)p.z._4_4_);
      }
    }
  }
  ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&D);
  bVar7 = HasVertexNormals(this);
  if (bVar7) {
    uVar11 = ON_SimpleArray<ON_3fVector>::Count(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
    ON_TextLog::Print(dump,"%d mesh vertex normals:\n",(ulong)uVar11);
    ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&indent2_2.m_bEnabled,dump);
    Internal_PrintMeshArrayHash
              (dump,&(this->m_N).super_ON_SimpleArray<ON_3fVector>,L"m_N array hash",true);
    for (p.z._4_4_ = 0; (int)p.z._4_4_ < iVar10; p.z._4_4_ = p.z._4_4_ + 1) {
      if ((p.z._4_4_ == 8) && (0x10 < iVar10)) {
        ON_TextLog::Print(dump,"...\n");
        p.z._4_4_ = iVar10 - 8;
      }
      else {
        pOVar17 = ON_SimpleArray<ON_3fVector>::operator[]
                            (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,p.z._4_4_);
        ON_3dPoint::operator=((ON_3dPoint *)&q.z,pOVar17);
        ON_TextLog::Print(dump,"m_N[%d] = (%g,%g,%g)\n",SUB84(q.z,0),p.x,p.y,(ulong)p.z._4_4_);
      }
    }
    ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&indent2_2.m_bEnabled);
  }
  bVar7 = HasTextureCoordinates(this);
  if (bVar7) {
    uVar11 = ON_SimpleArray<ON_2fPoint>::Count(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
    ON_TextLog::Print(dump,"%d mesh vertex texture coordinates:\n",(ulong)uVar11);
    ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&tp.y,dump);
    Internal_PrintMeshArrayHash
              (dump,&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,L"m_T array hash",true);
    for (p.z._4_4_ = 0; (int)p.z._4_4_ < iVar10; p.z._4_4_ = p.z._4_4_ + 1) {
      if ((p.z._4_4_ == 8) && (0x10 < iVar10)) {
        ON_TextLog::Print(dump,"...\n");
        p.z._4_4_ = iVar10 - 8;
      }
      else {
        p_01 = ON_SimpleArray<ON_2fPoint>::operator[]
                         (&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,p.z._4_4_);
        ON_2dPoint::ON_2dPoint((ON_2dPoint *)&indent2_3.m_bEnabled,p_01);
        ON_TextLog::Print(dump,"m_T[%d] = (%g,%g)\n",indent2_3._8_4_,tp.x,(ulong)p.z._4_4_);
      }
    }
    ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&tp.y);
  }
  bVar7 = HasSurfaceParameters(this);
  if (bVar7) {
    uVar11 = ON_SimpleArray<ON_2dPoint>::Count(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
    ON_TextLog::Print(dump,"%d mesh vertex surface parameters:\n",(ulong)uVar11);
    ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&srfuv.y,dump);
    Internal_PrintMeshArrayHash
              (dump,&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,L"m_S array hash",true);
    for (p.z._4_4_ = 0; (int)p.z._4_4_ < iVar10; p.z._4_4_ = p.z._4_4_ + 1) {
      if ((p.z._4_4_ == 8) && (0x10 < iVar10)) {
        ON_TextLog::Print(dump,"...\n");
        p.z._4_4_ = iVar10 - 8;
      }
      else {
        pOVar13 = ON_SimpleArray<ON_2dPoint>::operator[]
                            (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>,p.z._4_4_);
        srfuv.x = pOVar13->y;
        ON_TextLog::Print(dump,"m_S[%d] = (%g,%g)\n",SUB84(pOVar13->x,0),srfuv.x,(ulong)p.z._4_4_);
      }
    }
    ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&srfuv.y);
  }
  bVar7 = HasVertexColors(this);
  if (bVar7) {
    uVar11 = ON_SimpleArray<ON_Color>::Count(&this->m_C);
    ON_TextLog::Print(dump,"%d mesh vertex colors:\n",(ulong)uVar11);
    ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&s,dump);
    Internal_PrintMeshArrayHash(dump,&this->m_C,L"m_C array hash",true);
    for (p.z._4_4_ = 0; (int)p.z._4_4_ < iVar10; p.z._4_4_ = p.z._4_4_ + 1) {
      if ((p.z._4_4_ == 8) && (0x10 < iVar10)) {
        ON_TextLog::Print(dump,"...\n");
        p.z._4_4_ = iVar10 - 8;
      }
      else {
        pOVar14 = ON_SimpleArray<ON_Color>::operator[](&this->m_C,p.z._4_4_);
        ON_Color::ToString((ON_Color *)&indent2_5.m_bEnabled,(TextFormat)pOVar14,L'\x0e',false);
        ON_wString::operator_cast_to_wchar_t_((ON_wString *)&indent2_5.m_bEnabled);
        ON_TextLog::Print(dump,L"m_C[%d] = %s\n",(ulong)p.z._4_4_);
        ON_wString::~ON_wString((ON_wString *)&indent2_5.m_bEnabled);
      }
    }
    ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&s);
  }
  bVar7 = HasPrincipalCurvatures(this);
  if (bVar7) {
    uVar11 = ON_SimpleArray<ON_SurfaceCurvature>::Count(&this->m_K);
    ON_TextLog::Print(dump,"%d mesh vertex principal curvatures:\n",(ulong)uVar11);
    ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)local_1e0,dump);
    Internal_PrintMeshArrayHash(dump,&this->m_K,L"m_K array hash",true);
    for (p.z._4_4_ = 0; (int)p.z._4_4_ < iVar10; p.z._4_4_ = p.z._4_4_ + 1) {
      if ((p.z._4_4_ == 8) && (0x10 < iVar10)) {
        ON_TextLog::Print(dump,"...\n");
        p.z._4_4_ = iVar10 - 8;
      }
      else {
        pOVar15 = ON_SimpleArray<ON_SurfaceCurvature>::operator[](&this->m_K,p.z._4_4_);
        ON_TextLog::Print(dump,"m_K[%d] = (%g,%g)\n",SUB84(pOVar15->k1,0),pOVar15->k2,
                          (ulong)p.z._4_4_);
      }
    }
    ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)local_1e0);
  }
  uVar11 = ON_SimpleArray<ON_MeshFace>::Count(&this->m_F);
  ON_TextLog::Print(dump,"%d mesh faces:\n",(ulong)uVar11);
  ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&indent2_7.m_bEnabled,dump);
  Internal_PrintMeshArrayHash(dump,&this->m_F,L"m_F array hash",true);
  for (p.z._4_4_ = 0; (int)p.z._4_4_ < iVar9; p.z._4_4_ = p.z._4_4_ + 1) {
    if ((p.z._4_4_ == 8) && (0x10 < iVar9)) {
      ON_TextLog::Print(dump,"...\n");
      p.z._4_4_ = iVar9 - 8;
    }
    else {
      pOVar16 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,p.z._4_4_);
      iVar10 = pOVar16->vi[2];
      pOVar16 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,p.z._4_4_);
      if (iVar10 == pOVar16->vi[3]) {
        pOVar16 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,p.z._4_4_);
        uVar11 = pOVar16->vi[0];
        pOVar16 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,p.z._4_4_);
        uVar12 = pOVar16->vi[1];
        pOVar16 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,p.z._4_4_);
        ON_TextLog::Print(dump,"m_F[%d].vi = (%d,%d,%d)\n",(ulong)p.z._4_4_,(ulong)uVar11,
                          (ulong)uVar12,(ulong)(uint)pOVar16->vi[2]);
      }
      else {
        pOVar16 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,p.z._4_4_);
        uVar11 = pOVar16->vi[0];
        pOVar16 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,p.z._4_4_);
        uVar12 = pOVar16->vi[1];
        pOVar16 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,p.z._4_4_);
        uVar2 = pOVar16->vi[2];
        pOVar16 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,p.z._4_4_);
        ON_TextLog::Print(dump,"m_F[%d].vi = (%d,%d,%d,%d)\n",(ulong)p.z._4_4_,(ulong)uVar11,
                          (ulong)uVar12,(ulong)uVar2,pOVar16->vi[3]);
      }
    }
  }
  ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&indent2_7.m_bEnabled);
  bVar7 = HasFaceNormals(this);
  if (bVar7) {
    uVar11 = ON_SimpleArray<ON_3fVector>::Count(&(this->m_FN).super_ON_SimpleArray<ON_3fVector>);
    ON_TextLog::Print(dump,"%d mesh face normals:\n",(ulong)uVar11);
    ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&mesh_face_list.m_faces,dump);
    for (p.z._4_4_ = 0; (int)p.z._4_4_ < iVar9; p.z._4_4_ = p.z._4_4_ + 1) {
      if ((p.z._4_4_ == 8) && (0x10 < iVar9)) {
        ON_TextLog::Print(dump,"...\n");
        p.z._4_4_ = iVar9 - 8;
      }
      else {
        pOVar17 = ON_SimpleArray<ON_3fVector>::operator[]
                            (&(this->m_FN).super_ON_SimpleArray<ON_3fVector>,p.z._4_4_);
        ON_3dPoint::operator=((ON_3dPoint *)&q.z,pOVar17);
        ON_TextLog::Print(dump,"m_FN[%d] = (%g,%g,%g)\n",SUB84(q.z,0),p.x,p.y,(ulong)p.z._4_4_);
      }
    }
    ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&mesh_face_list.m_faces);
  }
  bVar7 = HasNgons(this);
  if (bVar7) {
    ON_MeshFaceList::ON_MeshFaceList((ON_MeshFaceList *)local_230,this);
    indent2_8._12_4_ = NgonCount(this);
    ON_TextLog::Print(dump,"%d mesh n-gons:\n",(ulong)(uint)indent2_8._12_4_);
    ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&ngon,dump);
    for (p.z._4_4_ = 0; (int)p.z._4_4_ < (int)indent2_8._12_4_; p.z._4_4_ = p.z._4_4_ + 1) {
      if ((p.z._4_4_ == 8) && (0x10 < (int)indent2_8._12_4_)) {
        ON_TextLog::Print(dump,"...\n");
        p.z._4_4_ = indent2_8._12_4_ - 8;
      }
      else {
        this_01 = Ngon(this,p.z._4_4_);
        if (this_01 == (ON_MeshNgon *)0x0) {
          ON_TextLog::Print(dump,"Ngon(%d) = null\n",(ulong)p.z._4_4_);
        }
        else {
          ON_TextLog::Print(dump,"Ngon(%d): ",(ulong)p.z._4_4_);
          ON_MeshNgon::Dump(this_01,dump);
          uVar11 = ON_MeshNgon::BoundaryEdgeCount(this_01,(ON_MeshFaceList *)local_230);
          uVar12 = ON_MeshNgon::OuterBoundaryEdgeCount(this_01);
          ON_TextLog::Print(dump," boundary counts outer = %d, inner = %d",(ulong)uVar12,
                            (ulong)(uVar11 - uVar12));
          ON_TextLog::Print(dump,"\n");
        }
      }
    }
    ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&ngon);
  }
  ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&indent2.m_bEnabled);
  return;
}

Assistant:

void ON_Mesh::Dump( ON_TextLog& dump ) const
{
  const int half_max = 8;

  const int fcount = m_F.Count();
  int i;
  const int vcount = m_V.Count();
  ON_3dPoint p, q;

  bool bDoubles =    vcount > 0 
                  && HasDoublePrecisionVertices()
                  && HasSynchronizedDoubleAndSinglePrecisionVertices();

  dump.Print("ON_Mesh: vertex count = %d  facet count = %d\n", m_V.Count(), m_F.Count() );
  dump.Print("double precision: %s\n",bDoubles?"true":"false");
  dump.Print("vertex normals:   %s\n",HasVertexNormals()?"true":"false");
  dump.Print("face normals:     %s\n",HasFaceNormals()?"true":"false");
  dump.Print("n-gons:           %s\n",HasNgons()?"true":"false");
  dump.Print("srf parameters:   %s\n",HasSurfaceParameters()?"true":"false");
  dump.Print("tex coords:       %s\n",HasTextureCoordinates()?"true":"false");
  dump.Print("vertex kappa:     %s\n",HasPrincipalCurvatures()?"true":"false");
  dump.Print("vertex colors:    %s\n",HasVertexColors()?"true":"false");
  dump.Print("m_Ctag:\n"); dump.PushIndent(); m_Ctag.Dump(dump); dump.PopIndent();
  dump.Print("m_packed_tex_rotate: %s\n",m_packed_tex_rotate?"true":"false");
  dump.Print("m_packed_tex_domain: (%g,%g)x(%g,%g)\n",
             m_packed_tex_domain[0][0],m_packed_tex_domain[0][1],
             m_packed_tex_domain[1][0],m_packed_tex_domain[1][1]);
  dump.Print("m_srf_domain: (%g,%g)x(%g,%g)\n",m_srf_domain[0][0],m_srf_domain[0][1],m_srf_domain[1][0],m_srf_domain[1][1]);
  dump.Print("m_srf_scale: %g,%g\n",m_srf_scale[0],m_srf_scale[0]);
  dump.Print("m_Ttag:\n"); dump.PushIndent(); m_Ttag.Dump(dump); dump.PopIndent();
  dump.Print( ON_wString(L"Memory used: ")  + ON_wString::ToMemorySize(this->SizeOf()) + ON_wString(L"\n") );


  const ON_MeshParameters* mp = this->MeshParameters();
  if (nullptr != mp)
  {
    ON_String description;
    switch (mp->GeometrySettingsType(true))
    {
    case ON_MeshParameters::Type::Unset:
      description = ON_String::EmptyString;
      break;
    case ON_MeshParameters::Type::Default:
      description = ON_String("ON_MeshParameters::DefaultMesh");
      break;
    case ON_MeshParameters::Type::FastRender:
      description = ON_String("ON_MeshParameters::FastRenderMesh");
      break;
    case ON_MeshParameters::Type::QualityRender:
      description = ON_String("ON_MeshParameters::QualityRenderMesh");
      break;
    case ON_MeshParameters::Type::DefaultAnalysis:
      description = ON_String("ON_MeshParameters::DefaultAnalysisMesh");
      break;
    case ON_MeshParameters::Type::FromMeshDensity:
      description = ON_String::FormatToString("ON_MeshParameters::CreateFromMeshDensity(%g)", mp->MeshDensity());
      break;
    case ON_MeshParameters::Type::Custom:
      description = ON_String::EmptyString;
      break;
    default:
      description = ON_String::EmptyString;
      break;
    }

    dump.PrintNewLine();
    if (description.IsNotEmpty())
    {
      dump.Print("NURBS, ON_Brep, ON_Extrusion meshing parameters:\n");
      {
        const ON_TextLogIndent indent1(dump);
        dump.Print("%s\n", static_cast<const char*>(description));
      }
      dump.Print("SubD meshing parameters:\n");
      {
        const ON_TextLogIndent indent1(dump);
        const ON_SubDDisplayParameters subdmp = mp->SubDDisplayParameters();
        subdmp.Dump(dump);
      }
    }
    else
    {
      dump.Print("Custom meshing parameters:\n");
      const ON_TextLogIndent indent1(dump);
      mp->Dump(dump);
    }
    dump.PrintNewLine();
  }

  const ON_TextLogIndent indent1(dump);

  dump.Print("%d mesh vertices:\n",m_V.Count());
  {
    const ON_TextLogIndent indent2(dump);
    Internal_PrintMeshArrayHash(dump, m_V, L"m_V array hash", true);
    const ON_3dPoint* D = 0;
    if ( bDoubles )
    {
      Internal_PrintMeshArrayHash(dump, m_dV, L"m_dV array hash", true);
      D = DoublePrecisionVertices().Array();
    }
    for (i = 0; i < vcount; i++)
    {
      if ( i == half_max && 2*half_max < vcount )
      {
        dump.Print("...\n");
        i = vcount-half_max;
      }
      else
      {
        p = m_V[i];
        if ( 0 != D )
        {
          q = D[i];
          dump.Print("m_V[%d] = (%.17g,%.17g,%.17g) D = (%.17g,%.17g,%.17g)\n",
                     i,
                     p.x,p.y,p.z,
                     q.x,q.y,q.z
                     );
        }
        else
        {
          dump.Print("m_V[%d] = (%g,%g,%g)\n",i,p.x,p.y,p.z);
        }
      }
    }
  }

  if ( HasVertexNormals() )
  {
    dump.Print("%d mesh vertex normals:\n",m_N.Count());
    {
      const ON_TextLogIndent indent2(dump);
      Internal_PrintMeshArrayHash(dump, m_N, L"m_N array hash", true);
      for (i = 0; i < vcount; i++)
      {
        if ( i == half_max && 2*half_max < vcount )
        {
          dump.Print("...\n");
          i = vcount-half_max;
        }
        else
        {
          p = m_N[i];
          dump.Print("m_N[%d] = (%g,%g,%g)\n",i,p.x,p.y,p.z);
        }
      }
    }
  }

  if ( HasTextureCoordinates() )
  {
    dump.Print("%d mesh vertex texture coordinates:\n",m_T.Count());
    {
      const ON_TextLogIndent indent2(dump);
      Internal_PrintMeshArrayHash(dump, m_T, L"m_T array hash", true);
      for (i = 0; i < vcount; i++)
      {
        if ( i == half_max && 2*half_max < vcount )
        {
          dump.Print("...\n");
          i = vcount-half_max;
        }
        else
        {
          const ON_2dPoint tp(m_T[i]);
          dump.Print("m_T[%d] = (%g,%g)\n",i,tp.x,tp.y);
        }
      }
    }
  }

  if ( HasSurfaceParameters() )
  {
    dump.Print("%d mesh vertex surface parameters:\n",m_S.Count());
    {
      const ON_TextLogIndent indent2(dump);
      Internal_PrintMeshArrayHash(dump, m_S, L"m_S array hash", true);
      for (i = 0; i < vcount; i++)
      {
        if ( i == half_max && 2*half_max < vcount )
        {
          dump.Print("...\n");
          i = vcount-half_max;
        }
        else
        {
          const ON_2dPoint srfuv = m_S[i];
          dump.Print("m_S[%d] = (%g,%g)\n",i, srfuv.x, srfuv.y);
        }
      }
    }
  }

  if (this->HasVertexColors())
  {
    dump.Print("%d mesh vertex colors:\n", m_C.Count());
    {
      const ON_TextLogIndent indent2(dump);
      Internal_PrintMeshArrayHash(dump, m_C, L"m_C array hash", true);
      for (i = 0; i < vcount; i++)
      {
        if (i == half_max && 2 * half_max < vcount)
        {
          dump.Print("...\n");
          i = vcount - half_max;
        }
        else
        {
          const ON_wString s = m_C[i].ToString(ON_Color::TextFormat::HashRGBa, 0, true);
          dump.Print(L"m_C[%d] = %s\n", i, static_cast<const wchar_t*>(s));
        }
      }
    }
  }


  if (this->HasPrincipalCurvatures())
  {
    dump.Print("%d mesh vertex principal curvatures:\n", m_K.Count());
    {
      const ON_TextLogIndent indent2(dump);
      Internal_PrintMeshArrayHash(dump, m_K, L"m_K array hash", true);
      for (i = 0; i < vcount; i++)
      {
        if (i == half_max && 2 * half_max < vcount)
        {
          dump.Print("...\n");
          i = vcount - half_max;
        }
        else
        {
          const ON_SurfaceCurvature k = m_K[i];
          dump.Print("m_K[%d] = (%g,%g)\n", i, k.k1, k.k2);
        }
      }
    }
  }


  dump.Print("%d mesh faces:\n",m_F.Count());
  {
    const ON_TextLogIndent indent2(dump);
    Internal_PrintMeshArrayHash(dump, m_F, L"m_F array hash", true);
    for (i = 0; i < fcount; i++)
    {
      if ( i == half_max && 2*half_max < fcount )
      {
        dump.Print("...\n");
        i = fcount-half_max;
      }
      else if ( m_F[i].vi[2] == m_F[i].vi[3] )
        dump.Print("m_F[%d].vi = (%d,%d,%d)\n",i,m_F[i].vi[0],m_F[i].vi[1],m_F[i].vi[2]);
      else
        dump.Print("m_F[%d].vi = (%d,%d,%d,%d)\n",i,m_F[i].vi[0],m_F[i].vi[1],m_F[i].vi[2],m_F[i].vi[3]);
    }
  }

  if ( HasFaceNormals() )
  {
    dump.Print("%d mesh face normals:\n",m_FN.Count());
    {
      const ON_TextLogIndent indent2(dump);
      for (i = 0; i < fcount; i++)
      {
        if ( i == half_max && 2*half_max < fcount )
        {
          dump.Print("...\n");
          i = fcount-half_max;
        }
        else
        {
          p = m_FN[i];
          dump.Print("m_FN[%d] = (%g,%g,%g)\n",i,p.x,p.y,p.z);
        }
      }
    }
  }

  if ( HasNgons() )
  {
    const ON_MeshFaceList mesh_face_list(this);

    const int ngon_count = NgonCount();
    dump.Print("%d mesh n-gons:\n",ngon_count);
    {
      const ON_TextLogIndent indent2(dump);
      for (i = 0; i < ngon_count; i++)
      {
        if ( i == half_max && 2*half_max < ngon_count )
        {
          dump.Print("...\n");
          i = ngon_count-half_max;
        }
        else
        {
          const ON_MeshNgon* ngon = Ngon(i);
          if ( 0 == ngon )
            dump.Print("Ngon(%d) = null\n",i);
          else
          {
            dump.Print("Ngon(%d): ",i);
            ngon->Dump(dump);
            const int bcount = (int)ngon->BoundaryEdgeCount(mesh_face_list);
            const int outer_boundary_count = (int)ngon->OuterBoundaryEdgeCount();
            const int inner_boundary_count = bcount - outer_boundary_count;
            dump.Print(" boundary counts outer = %d, inner = %d", outer_boundary_count, inner_boundary_count);
            dump.Print("\n");
          }
        }
      }
    }
  }
}